

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)12>_> *
vkt::sparse::makeBufferView
          (Move<vk::Handle<(vk::HandleType)12>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice vkDevice,VkBuffer buffer,VkFormat format,VkDeviceSize offset,VkDeviceSize size)

{
  undefined1 local_70 [8];
  VkBufferViewCreateInfo bufferViewParams;
  VkDeviceSize offset_local;
  VkFormat format_local;
  VkDevice vkDevice_local;
  DeviceInterface *vk_local;
  VkBuffer buffer_local;
  
  local_70._0_4_ = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  bufferViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferViewParams._4_4_ = 0;
  bufferViewParams.pNext._0_4_ = 0;
  bufferViewParams.offset = size;
  bufferViewParams._16_8_ = buffer.m_internal;
  bufferViewParams.buffer.m_internal._0_4_ = format;
  bufferViewParams._32_8_ = offset;
  bufferViewParams.range = offset;
  ::vk::createBufferView
            (__return_storage_ptr__,vk,vkDevice,(VkBufferViewCreateInfo *)local_70,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkBufferView> makeBufferView (const DeviceInterface&	vk,
								   const VkDevice			vkDevice,
								   const VkBuffer			buffer,
								   const VkFormat			format,
								   const VkDeviceSize		offset,
								   const VkDeviceSize		size)
{
	const VkBufferViewCreateInfo bufferViewParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,	// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0u,											// VkBufferViewCreateFlags	flags;
		buffer,										// VkBuffer					buffer;
		format,										// VkFormat					format;
		offset,										// VkDeviceSize				offset;
		size,										// VkDeviceSize				range;
	};
	return createBufferView(vk, vkDevice, &bufferViewParams);
}